

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnReturnCallIndirectExpr
          (ExprVisitorDelegate *this,ReturnCallIndirectExpr *expr)

{
  WatWriter *pWVar1;
  Index index;
  Var type_var;
  Info local_68;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo(&local_68,(Opcode *)&Opcode::ReturnCallIndirect_Opcode);
  WritePuts(pWVar1,local_68.name,Space);
  pWVar1 = this->writer_;
  WritePuts(pWVar1,"(",None);
  WritePuts(pWVar1,"type",Space);
  pWVar1->indent_ = pWVar1->indent_ + 2;
  if ((expr->decl).has_func_type == true) {
    Var::Var((Var *)&local_68,&(expr->decl).type_var);
  }
  else {
    index = Module::GetFuncTypeIndex((this->writer_->super_ModuleContext).module,&expr->decl);
    Var::Var((Var *)&local_68,index,&(expr->super_ExprMixin<(wabt::ExprType)41>).super_Expr.loc);
  }
  WriteVar(this->writer_,(Var *)&local_68,Space);
  WriteClose(this->writer_,Newline);
  Var::~Var((Var *)&local_68);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnReturnCallIndirectExpr(
    ReturnCallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::ReturnCallIndirect_Opcode.GetName());
  writer_->WriteOpenSpace("type");
  const auto type_var =
      expr->decl.has_func_type
          ? expr->decl.type_var
          : Var{writer_->module.GetFuncTypeIndex(expr->decl), expr->loc};
  writer_->WriteVar(type_var, NextChar::Space);
  writer_->WriteCloseNewline();
  return Result::Ok;
}